

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_RequiresMultiFlags_Test::~TApp_RequiresMultiFlags_Test(TApp_RequiresMultiFlags_Test *this)

{
  TApp_RequiresMultiFlags_Test *this_local;
  
  ~TApp_RequiresMultiFlags_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiresMultiFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    CLI::Option *opt2 = app.add_flag("--opt2");
    CLI::Option *opt3 = app.add_flag("--opt3");
    app.add_flag("--optall")->requires(opt1, opt2, opt3);

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--optall"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt2", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1", "--opt2", "--opt3"};
    run();
}